

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error ft_stroke_border_grow(SW_FT_StrokeBorder border,SW_FT_UInt new_points)

{
  void *pvVar1;
  int in_ESI;
  int *in_RDI;
  SW_FT_UInt cur_max;
  SW_FT_Error error;
  SW_FT_UInt new_max;
  SW_FT_UInt old_max;
  uint local_1c;
  
  local_1c = in_RDI[1];
  if (local_1c < (uint)(*in_RDI + in_ESI)) {
    for (; local_1c < (uint)(*in_RDI + in_ESI); local_1c = (local_1c >> 1) + 0x10 + local_1c) {
    }
    pvVar1 = realloc(*(void **)(in_RDI + 2),(ulong)local_1c << 4);
    *(void **)(in_RDI + 2) = pvVar1;
    pvVar1 = realloc(*(void **)(in_RDI + 4),(ulong)local_1c);
    *(void **)(in_RDI + 4) = pvVar1;
    if ((*(long *)(in_RDI + 2) != 0) && (*(long *)(in_RDI + 4) != 0)) {
      in_RDI[1] = local_1c;
    }
  }
  return 0;
}

Assistant:

static SW_FT_Error ft_stroke_border_grow(SW_FT_StrokeBorder border,
                                         SW_FT_UInt         new_points)
{
    SW_FT_UInt  old_max = border->max_points;
    SW_FT_UInt  new_max = border->num_points + new_points;
    SW_FT_Error error = 0;

    if (new_max > old_max) {
        SW_FT_UInt cur_max = old_max;

        while (cur_max < new_max) cur_max += (cur_max >> 1) + 16;

        border->points = (SW_FT_Vector*)realloc(border->points,
                                                cur_max * sizeof(SW_FT_Vector));
        border->tags =
            (SW_FT_Byte*)realloc(border->tags, cur_max * sizeof(SW_FT_Byte));

        if (!border->points || !border->tags) goto Exit;

        border->max_points = cur_max;
    }

Exit:
    return error;
}